

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata_Linear::PrintDetailedMap(VmaBlockMetadata_Linear *this,VmaJsonWriter *json)

{
  SECOND_VECTOR_MODE SVar1;
  VmaBlockMetadata_Linear *pVVar2;
  ulong uVar3;
  VmaSuballocation *pVVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  VkDeviceSize unusedRangeSize;
  long lVar8;
  ulong uVar9;
  VmaBlockMetadata_Linear *pVVar10;
  ulong uVar11;
  VmaBlockMetadata_Linear *pVVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 *puVar17;
  VmaBlockMetadata_Linear *this_00;
  size_t unusedRangeCount;
  void *pvVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  long lStack_70;
  
  bVar23 = this->m_1stVectorIndex == 0;
  bVar6 = !bVar23;
  pVVar2 = (VmaBlockMetadata_Linear *)(&this->m_Suballocations0)[bVar23].m_Count;
  SVar1 = this->m_2ndVectorMode;
  if (SVar1 == SECOND_VECTOR_RING_BUFFER) {
    uVar3 = (&this->m_Suballocations0)[bVar6].m_pArray[this->m_1stNullItemsBeginCount].offset;
    lVar8 = 0;
    lVar7 = 0;
    unusedRangeCount = 0;
    uVar13 = 0;
    pVVar10 = (VmaBlockMetadata_Linear *)0x0;
    while (uVar13 < uVar3) {
      pVVar12 = pVVar2;
      if (pVVar2 < pVVar10) {
        pVVar12 = pVVar10;
      }
      uVar11 = (long)pVVar10 << 5 | 0x10;
      while (pVVar10 = (VmaBlockMetadata_Linear *)
                       ((long)&(pVVar10->super_VmaBlockMetadata)._vptr_VmaBlockMetadata + 1),
            uVar9 = uVar3, uVar16 = 1, (long)pVVar10 - (long)pVVar12 != 1) {
        pVVar4 = (&this->m_Suballocations0)[bVar23].m_pArray;
        if (*(long *)((long)&pVVar4->offset + uVar11) != 0) {
          uVar16 = *(ulong *)((long)pVVar4 + (uVar11 - 0x10));
          lVar19 = *(long *)((long)pVVar4 + (uVar11 - 8));
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + lVar19;
          uVar9 = lVar19 + uVar16;
          pVVar12 = pVVar10;
          uVar16 = (ulong)(uVar13 < uVar16);
          break;
        }
        uVar11 = uVar11 + 0x20;
      }
      unusedRangeCount = unusedRangeCount + uVar16;
      uVar13 = uVar9;
      pVVar10 = pVVar12;
    }
  }
  else {
    lVar8 = 0;
    uVar13 = 0;
    lVar7 = 0;
    unusedRangeCount = 0;
  }
  uVar3 = (this->super_VmaBlockMetadata).m_Size;
  uVar11 = uVar3;
  if (SVar1 == SECOND_VECTOR_DOUBLE_STACK) {
    uVar11 = (&this->m_Suballocations0)[bVar23].m_pArray
             [(long)((long)&pVVar2[-1].m_2ndNullItemsCount + 7)].offset;
  }
  uVar9 = (&this->m_Suballocations0)[bVar6].m_Count;
  lVar19 = 0;
  sVar14 = this->m_1stNullItemsBeginCount;
  while (uVar13 < uVar11) {
    uVar16 = uVar9;
    if (uVar9 < sVar14) {
      uVar16 = sVar14;
    }
    uVar15 = sVar14 << 5 | 0x10;
    while (sVar14 = sVar14 + 1, uVar20 = uVar11, uVar22 = uVar3, sVar14 - uVar16 != 1) {
      pVVar4 = (&this->m_Suballocations0)[bVar6].m_pArray;
      if (*(long *)((long)&pVVar4->offset + uVar15) != 0) {
        uVar22 = *(ulong *)((long)pVVar4 + (uVar15 - 0x10));
        lVar21 = *(long *)((long)pVVar4 + (uVar15 - 8));
        lVar19 = lVar19 + 1;
        lVar7 = lVar7 + lVar21;
        uVar16 = sVar14;
        uVar20 = lVar21 + uVar22;
        break;
      }
      uVar15 = uVar15 + 0x20;
    }
    unusedRangeCount = unusedRangeCount + (uVar13 < uVar22);
    uVar13 = uVar20;
    sVar14 = uVar16;
  }
  if (SVar1 == SECOND_VECTOR_DOUBLE_STACK) {
    puVar17 = (undefined1 *)((long)&pVVar2[-1].m_2ndNullItemsCount + 7);
    while (uVar13 < uVar3) {
      lVar21 = -(long)puVar17;
      uVar16 = (long)puVar17 << 5 | 0x10;
      while (lVar21 = lVar21 + 1, uVar15 = uVar3, puVar17 = (undefined1 *)0xffffffffffffffff,
            uVar22 = 1, lVar21 != 2) {
        pVVar4 = (&this->m_Suballocations0)[bVar23].m_pArray;
        if (*(long *)((long)&pVVar4->offset + uVar16) != 0) {
          uVar22 = *(ulong *)((long)pVVar4 + (uVar16 - 0x10));
          lVar5 = *(long *)((long)pVVar4 + (uVar16 - 8));
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + lVar5;
          uVar15 = lVar5 + uVar22;
          puVar17 = (undefined1 *)-lVar21;
          uVar22 = (ulong)(uVar13 < uVar22);
          break;
        }
        uVar16 = uVar16 - 0x20;
      }
      unusedRangeCount = unusedRangeCount + uVar22;
      uVar13 = uVar15;
    }
  }
  pVVar10 = this;
  VmaBlockMetadata::PrintDetailedMap_Begin
            (&this->super_VmaBlockMetadata,json,uVar3 - lVar7,lVar8 + lVar19,unusedRangeCount);
  uVar13 = this->m_1stNullItemsBeginCount;
  if (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    uVar13 = (&this->m_Suballocations0)[bVar6].m_pArray[uVar13].offset;
    uVar16 = 0;
    pVVar12 = (VmaBlockMetadata_Linear *)0x0;
LAB_001a3572:
    if (uVar16 <= uVar13 && uVar13 - uVar16 != 0) {
      this_00 = pVVar2;
      if (pVVar2 < pVVar12) {
        this_00 = pVVar12;
      }
      lVar7 = (long)pVVar12 << 5;
      while (pVVar12 = (VmaBlockMetadata_Linear *)
                       ((long)&(pVVar12->super_VmaBlockMetadata)._vptr_VmaBlockMetadata + 1),
            (long)pVVar12 - (long)this_00 != 1) {
        pVVar4 = (&this->m_Suballocations0)[bVar23].m_pArray;
        pvVar18 = *(void **)((long)&pVVar4->userData + lVar7);
        if (pvVar18 != (void *)0x0) {
          uVar15 = *(ulong *)((long)&pVVar4->offset + lVar7);
          if (uVar16 <= uVar15 && uVar15 - uVar16 != 0) {
            VmaBlockMetadata::PrintDetailedMap_UnusedRange
                      (&this_00->super_VmaBlockMetadata,json,uVar16,uVar15 - uVar16);
            uVar15 = *(VkDeviceSize *)((long)&pVVar4->offset + lVar7);
            pvVar18 = *(void **)((long)&pVVar4->userData + lVar7);
          }
          pVVar10 = this;
          VmaBlockMetadata::PrintDetailedMap_Allocation
                    (&this->super_VmaBlockMetadata,json,uVar15,
                     *(VkDeviceSize *)((long)&pVVar4->size + lVar7),pvVar18);
          uVar16 = *(long *)((long)&pVVar4->size + lVar7) + *(long *)((long)&pVVar4->offset + lVar7)
          ;
          goto LAB_001a3572;
        }
        lVar7 = lVar7 + 0x20;
      }
      pVVar10 = this_00;
      VmaBlockMetadata::PrintDetailedMap_UnusedRange
                (&this_00->super_VmaBlockMetadata,json,uVar16,uVar13 - uVar16);
      uVar16 = uVar13;
      pVVar12 = this_00;
      goto LAB_001a3572;
    }
    uVar13 = this->m_1stNullItemsBeginCount;
  }
  else {
    uVar16 = 0;
  }
LAB_001a36d5:
  if (uVar16 <= uVar11 && uVar11 - uVar16 != 0) {
    uVar15 = uVar9;
    if (uVar9 < uVar13) {
      uVar15 = uVar13;
    }
    lVar7 = uVar13 << 5;
    while (uVar13 = uVar13 + 1, uVar13 - uVar15 != 1) {
      pVVar4 = (&this->m_Suballocations0)[bVar6].m_pArray;
      pvVar18 = *(void **)((long)&pVVar4->userData + lVar7);
      if (pvVar18 != (void *)0x0) {
        uVar15 = *(ulong *)((long)&pVVar4->offset + lVar7);
        if (uVar16 <= uVar15 && uVar15 - uVar16 != 0) {
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&pVVar10->super_VmaBlockMetadata,json,uVar16,uVar15 - uVar16);
          uVar15 = *(VkDeviceSize *)((long)&pVVar4->offset + lVar7);
          pvVar18 = *(void **)((long)&pVVar4->userData + lVar7);
        }
        pVVar10 = this;
        VmaBlockMetadata::PrintDetailedMap_Allocation
                  (&this->super_VmaBlockMetadata,json,uVar15,
                   *(VkDeviceSize *)((long)&pVVar4->size + lVar7),pvVar18);
        uVar16 = *(long *)((long)&pVVar4->size + lVar7) + *(long *)((long)&pVVar4->offset + lVar7);
        goto LAB_001a36d5;
      }
      lVar7 = lVar7 + 0x20;
    }
    VmaBlockMetadata::PrintDetailedMap_UnusedRange
              (&pVVar10->super_VmaBlockMetadata,json,uVar16,uVar11 - uVar16);
    uVar16 = uVar11;
    uVar13 = uVar15;
    goto LAB_001a36d5;
  }
  if (this->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) {
    lStack_70 = (&this->m_Suballocations0)[bVar23].m_Count - 1;
LAB_001a36fe:
    if (uVar16 <= uVar3 && uVar3 - uVar16 != 0) {
      lVar7 = -lStack_70;
      lVar8 = lStack_70 << 5;
      while (lVar7 = lVar7 + 1, lVar7 != 2) {
        pVVar4 = (&this->m_Suballocations0)[bVar23].m_pArray;
        pvVar18 = *(void **)((long)&pVVar4->userData + lVar8);
        if (pvVar18 != (void *)0x0) {
          uVar13 = *(ulong *)((long)&pVVar4->offset + lVar8);
          if (uVar16 <= uVar13 && uVar13 - uVar16 != 0) {
            VmaBlockMetadata::PrintDetailedMap_UnusedRange
                      (&pVVar10->super_VmaBlockMetadata,json,uVar16,uVar13 - uVar16);
            uVar13 = *(VkDeviceSize *)((long)&pVVar4->offset + lVar8);
            pvVar18 = *(void **)((long)&pVVar4->userData + lVar8);
          }
          pVVar10 = this;
          VmaBlockMetadata::PrintDetailedMap_Allocation
                    (&this->super_VmaBlockMetadata,json,uVar13,
                     *(VkDeviceSize *)((long)&pVVar4->size + lVar8),pvVar18);
          lStack_70 = -lVar7;
          uVar16 = *(long *)((long)&pVVar4->size + lVar8) + *(long *)((long)&pVVar4->offset + lVar8)
          ;
          goto LAB_001a36fe;
        }
        lVar8 = lVar8 + -0x20;
      }
      VmaBlockMetadata::PrintDetailedMap_UnusedRange
                (&pVVar10->super_VmaBlockMetadata,json,uVar16,uVar3 - uVar16);
      lStack_70 = -1;
      uVar16 = uVar3;
      goto LAB_001a36fe;
    }
  }
  VmaJsonWriter::EndArray(json);
  return;
}

Assistant:

void VmaBlockMetadata_Linear::PrintDetailedMap(class VmaJsonWriter& json) const
{
    const VkDeviceSize size = GetSize();
    const SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    const SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
    const size_t suballoc1stCount = suballocations1st.size();
    const size_t suballoc2ndCount = suballocations2nd.size();

    // FIRST PASS

    size_t unusedRangeCount = 0;
    VkDeviceSize usedBytes = 0;

    VkDeviceSize lastOffset = 0;

    size_t alloc2ndCount = 0;
    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    size_t nextAlloc1stIndex = m_1stNullItemsBeginCount;
    size_t alloc1stCount = 0;
    const VkDeviceSize freeSpace1stTo2ndEnd =
        m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK ? suballocations2nd.back().offset : size;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                ++unusedRangeCount;
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            ++alloc1stCount;
            usedBytes += suballoc.size;

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < size)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                ++unusedRangeCount;
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    const VkDeviceSize unusedBytes = size - usedBytes;
    PrintDetailedMap_Begin(json, unusedBytes, alloc1stCount + alloc2ndCount, unusedRangeCount);

    // SECOND PASS
    lastOffset = 0;

    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    const VkDeviceSize unusedRangeSize = freeSpace2ndTo1stEnd - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    nextAlloc1stIndex = m_1stNullItemsBeginCount;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < freeSpace1stTo2ndEnd)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                const VkDeviceSize unusedRangeSize = freeSpace1stTo2ndEnd - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    const VkDeviceSize unusedRangeSize = size - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    PrintDetailedMap_End(json);
}